

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

bool __thiscall TGAImage::flip_vertically(TGAImage *this)

{
  uchar *__src;
  uchar *puVar1;
  uchar *puVar2;
  void *__dest;
  ulong uVar3;
  int iVar4;
  ulong __n;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  puVar1 = this->data;
  if (puVar1 != (uchar *)0x0) {
    __n = (long)this->bytespp * (long)this->width;
    __dest = operator_new__(__n);
    uVar6 = this->height >> 1;
    uVar3 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar3;
    }
    iVar4 = -1;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      lVar5 = (long)(this->height + iVar4) * __n;
      puVar2 = this->data;
      __src = puVar2 + uVar3;
      memmove(__dest,__src,__n);
      memmove(__src,puVar2 + lVar5,__n);
      memmove(this->data + lVar5,__dest,__n);
      iVar4 = iVar4 + -1;
      uVar3 = uVar3 + __n;
    }
    operator_delete__(__dest);
  }
  return puVar1 != (uchar *)0x0;
}

Assistant:

bool TGAImage::flip_vertically() {
    if (!data) return false;
    unsigned long bytes_per_line = width*bytespp;
    unsigned char *line = new unsigned char[bytes_per_line];
    int half = height>>1;
    for (int j=0; j<half; j++) {
        unsigned long l1 = j*bytes_per_line;
        unsigned long l2 = (height-1-j)*bytes_per_line;
        memmove((void *)line,      (void *)(data+l1), bytes_per_line);
        memmove((void *)(data+l1), (void *)(data+l2), bytes_per_line);
        memmove((void *)(data+l2), (void *)line,      bytes_per_line);
    }
    delete [] line;
    return true;
}